

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Algorithm_Base.cpp
# Opt level: O0

void __thiscall
OSTEI_VRR_Algorithm_Base::PruneQuartets_(OSTEI_VRR_Algorithm_Base *this,QuartetSet *q)

{
  bool bVar1;
  int iVar2;
  undefined8 in_RSI;
  pair<std::_Rb_tree_const_iterator<Quartet>,_bool> pVar3;
  Quartet *it;
  iterator __end1;
  iterator __begin1;
  QuartetSet *__range1;
  QuartetSet qnew;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  _Rb_tree_const_iterator<Quartet> in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff89;
  set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *in_stack_ffffffffffffff90;
  _Self local_58;
  _Self local_50;
  undefined8 local_48;
  undefined8 local_10;
  
  local_10 = in_RSI;
  std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::set
            ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)0x11e871);
  local_48 = local_10;
  local_50._M_node =
       (_Base_ptr)
       std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::begin
                 ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)
                  CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  local_58._M_node =
       (_Base_ptr)
       std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::end
                 ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)
                  CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  while (bVar1 = std::operator!=(&local_50,&local_58), bVar1) {
    std::_Rb_tree_const_iterator<Quartet>::operator*
              ((_Rb_tree_const_iterator<Quartet> *)in_stack_ffffffffffffff70._M_node);
    bVar1 = Quartet::operator_cast_to_bool((Quartet *)in_stack_ffffffffffffff70._M_node);
    if ((bVar1) && (iVar2 = Quartet::am((Quartet *)in_stack_ffffffffffffff70._M_node), 0 < iVar2)) {
      pVar3 = std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::insert
                        (in_stack_ffffffffffffff90,
                         (value_type *)CONCAT71(in_stack_ffffffffffffff89,in_stack_ffffffffffffff88)
                        );
      in_stack_ffffffffffffff70 = pVar3.first._M_node;
      in_stack_ffffffffffffff6f = pVar3.second;
      in_stack_ffffffffffffff88 = in_stack_ffffffffffffff6f;
    }
    std::_Rb_tree_const_iterator<Quartet>::operator++
              ((_Rb_tree_const_iterator<Quartet> *)in_stack_ffffffffffffff70._M_node);
  }
  std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::operator=
            ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)
             in_stack_ffffffffffffff70._M_node,
             (set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)
             CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::~set
            ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)0x11e96d);
  return;
}

Assistant:

void OSTEI_VRR_Algorithm_Base::PruneQuartets_(QuartetSet & q) const
{
    QuartetSet qnew;
 
    for(const auto & it : q)
    {
        if(it && it.am() > 0)
            qnew.insert(it);
    }

    q = qnew;
}